

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O2

int mg_session_check_struct_header(mg_session *session,uint8_t marker,uint8_t signature)

{
  size_t sVar1;
  char *fmt;
  
  sVar1 = session->in_cursor;
  if (session->in_end < sVar1 + 2) {
    fmt = "unexpected end of message";
  }
  else if (session->in_buffer[sVar1] == marker) {
    if (session->in_buffer[sVar1 + 1] == signature) {
      session->in_cursor = sVar1 + 2;
      return 0;
    }
    fmt = "wrong struct signature";
  }
  else {
    fmt = "wrong value marker";
  }
  mg_session_set_error(session,fmt);
  return -6;
}

Assistant:

int mg_session_check_struct_header(mg_session *session, uint8_t marker,
                                   uint8_t signature) {
  if (session->in_cursor + 2 > session->in_end) {
    mg_session_set_error(session, "unexpected end of message");
    return MG_ERROR_DECODING_FAILED;
  }
  uint8_t *header = (uint8_t *)(session->in_buffer + session->in_cursor);
  if (header[0] != marker) {
    mg_session_set_error(session, "wrong value marker");
    return MG_ERROR_DECODING_FAILED;
  }
  if (header[1] != signature) {
    mg_session_set_error(session, "wrong struct signature");
    return MG_ERROR_DECODING_FAILED;
  }
  session->in_cursor += 2;
  return 0;
}